

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

double ecs_time_measure(ecs_time_t *start)

{
  ecs_time_t t;
  double dVar1;
  ecs_time_t temp;
  ecs_time_t stop;
  ecs_time_t *start_local;
  
  (*ecs_os_api.get_time_)(&temp);
  t = ecs_time_sub(temp,*start);
  *start = temp;
  temp = t;
  dVar1 = ecs_time_to_double(t);
  return dVar1;
}

Assistant:

double ecs_time_measure(
    ecs_time_t *start)
{
    ecs_time_t stop, temp;
    ecs_os_get_time(&stop);
    temp = stop;
    stop = ecs_time_sub(stop, *start);
    *start = temp;
    return ecs_time_to_double(stop);
}